

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nginx.c
# Opt level: O3

ngx_pid_t ngx_exec_new_binary(ngx_cycle_t *cycle,char **argv)

{
  char *pcVar1;
  void ***pppvVar2;
  ngx_log_t *pnVar3;
  char **__ptr;
  int iVar4;
  ngx_pid_t nVar5;
  char **__ptr_00;
  char **ppcVar6;
  u_char *buf;
  int *piVar7;
  ulong uVar8;
  uint *puVar9;
  ngx_exec_ctx_t local_68;
  char **local_48;
  ngx_uint_t local_40;
  char **local_38;
  
  local_68.path = *argv;
  local_68.name = "new binary process";
  local_40 = 2;
  local_68.argv = argv;
  __ptr_00 = ngx_set_environment(cycle,&local_40);
  nVar5 = -1;
  if (__ptr_00 != (char **)0x0) {
    ppcVar6 = (char **)ngx_alloc((cycle->listening).nelts * 0xc + 8,cycle->log);
    if (ppcVar6 != (char **)0x0) {
      *(undefined2 *)((long)ppcVar6 + 4) = 0x3d58;
      *(undefined4 *)ppcVar6 = 0x4e49474e;
      buf = (u_char *)((long)ppcVar6 + 6);
      local_48 = ppcVar6;
      local_38 = argv;
      if ((cycle->listening).nelts != 0) {
        puVar9 = (uint *)(cycle->listening).elts;
        uVar8 = 0;
        do {
          buf = ngx_sprintf(buf,"%ud;",(ulong)*puVar9);
          uVar8 = uVar8 + 1;
          puVar9 = puVar9 + 0x38;
        } while (uVar8 < (cycle->listening).nelts);
      }
      __ptr = local_48;
      *buf = '\0';
      __ptr_00[local_40] = (char *)local_48;
      __ptr_00[local_40 + 1] =
           "SPARE=XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
      ;
      __ptr_00[local_40 + 2] = (char *)0x0;
      pcVar1 = *__ptr_00;
      local_40 = local_40 + 2;
      ppcVar6 = __ptr_00;
      while (pcVar1 != (char *)0x0) {
        ppcVar6 = ppcVar6 + 1;
        if ((cycle->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,cycle->log,0,"env: %s");
        }
        pcVar1 = *ppcVar6;
      }
      pppvVar2 = cycle->conf_ctx[ngx_core_module.index];
      local_68.envp = __ptr_00;
      iVar4 = rename((char *)pppvVar2[0x13],(char *)pppvVar2[0x15]);
      if (iVar4 == -1) {
        pnVar3 = cycle->log;
        if (1 < pnVar3->log_level) {
          piVar7 = __errno_location();
          ngx_log_error_core(2,pnVar3,*piVar7,
                             "rename() %s to %s failed before executing new binary process \"%s\"",
                             pppvVar2[0x13],pppvVar2[0x15],*local_38);
        }
        free(__ptr_00);
        free(__ptr);
        return -1;
      }
      nVar5 = ngx_execute(cycle,&local_68);
      if (((nVar5 == -1) &&
          (iVar4 = rename((char *)pppvVar2[0x15],(char *)pppvVar2[0x13]), iVar4 == -1)) &&
         (pnVar3 = cycle->log, 1 < pnVar3->log_level)) {
        piVar7 = __errno_location();
        ngx_log_error_core(2,pnVar3,*piVar7,
                           "rename() %s back to %s failed after an attempt to execute new binary process \"%s\""
                           ,pppvVar2[0x15],pppvVar2[0x13],*local_38);
      }
      free(__ptr_00);
      __ptr_00 = __ptr;
    }
    free(__ptr_00);
  }
  return nVar5;
}

Assistant:

ngx_pid_t
ngx_exec_new_binary(ngx_cycle_t *cycle, char *const *argv)
{
    char             **env, *var;
    u_char            *p;
    ngx_uint_t         i, n;
    ngx_pid_t          pid;
    ngx_exec_ctx_t     ctx;
    ngx_core_conf_t   *ccf;
    ngx_listening_t   *ls;

    ngx_memzero(&ctx, sizeof(ngx_exec_ctx_t));

    ctx.path = argv[0];
    ctx.name = "new binary process";
    ctx.argv = argv;

    n = 2;
    env = ngx_set_environment(cycle, &n);
    if (env == NULL) {
        return NGX_INVALID_PID;
    }

    var = ngx_alloc(sizeof(NGINX_VAR)
                    + cycle->listening.nelts * (NGX_INT32_LEN + 1) + 2,
                    cycle->log);
    if (var == NULL) {
        ngx_free(env);
        return NGX_INVALID_PID;
    }

    p = ngx_cpymem(var, NGINX_VAR "=", sizeof(NGINX_VAR));

    ls = cycle->listening.elts;
    for (i = 0; i < cycle->listening.nelts; i++) {
        p = ngx_sprintf(p, "%ud;", ls[i].fd);
    }

    *p = '\0';

    env[n++] = var;

#if (NGX_SETPROCTITLE_USES_ENV)

    /* allocate the spare 300 bytes for the new binary process title */

    env[n++] = "SPARE=XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX";

#endif

    env[n] = NULL;

#if (NGX_DEBUG)
    {
    char  **e;
    for (e = env; *e; e++) {
        ngx_log_debug1(NGX_LOG_DEBUG_CORE, cycle->log, 0, "env: %s", *e);
    }
    }
#endif

    ctx.envp = (char *const *) env;

    ccf = (ngx_core_conf_t *) ngx_get_conf(cycle->conf_ctx, ngx_core_module);

    if (ngx_rename_file(ccf->pid.data, ccf->oldpid.data) == NGX_FILE_ERROR) {
        ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_errno,
                      ngx_rename_file_n " %s to %s failed "
                      "before executing new binary process \"%s\"",
                      ccf->pid.data, ccf->oldpid.data, argv[0]);

        ngx_free(env);
        ngx_free(var);

        return NGX_INVALID_PID;
    }

    pid = ngx_execute(cycle, &ctx);

    if (pid == NGX_INVALID_PID) {
        if (ngx_rename_file(ccf->oldpid.data, ccf->pid.data)
            == NGX_FILE_ERROR)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_errno,
                          ngx_rename_file_n " %s back to %s failed after "
                          "an attempt to execute new binary process \"%s\"",
                          ccf->oldpid.data, ccf->pid.data, argv[0]);
        }
    }

    ngx_free(env);
    ngx_free(var);

    return pid;
}